

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O2

optional<(anonymous_namespace)::VoicePos> *
anon_unknown.dwarf_50b73::GetSampleOffset
          (optional<(anonymous_namespace)::VoicePos> *__return_storage_ptr__,
          BufferlistItem *BufferList,ALenum OffsetType,double Offset)

{
  char cVar1;
  BufferStorage *this;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ALuint AVar6;
  double dVar7;
  double dVar8;
  double dbloff;
  double local_30;
  
  __return_storage_ptr__->mHasValue = false;
  *(undefined8 *)&__return_storage_ptr__->field_1 = 0;
  (__return_storage_ptr__->field_1).mValue.bufferitem = (BufferlistItem *)0x0;
  while( true ) {
    if (BufferList == (BufferlistItem *)0x0) {
      return __return_storage_ptr__;
    }
    this = BufferList->mBuffer;
    if (this != (BufferStorage *)0x0) break;
    BufferList = (BufferList->mNext)._M_b._M_p;
  }
  if (OffsetType == 0x1026) {
    cVar1 = *(char *)((long)&this[1].mData.
                             super__Vector_base<al::byte,_al::allocator<al::byte,_16UL>_>._M_impl.
                             super__Vector_impl_data._M_start + 4);
    if (cVar1 == -0x7f) {
      iVar5 = (*(int *)((long)&this[1].mData.
                               super__Vector_base<al::byte,_al::allocator<al::byte,_16UL>_>._M_impl.
                               super__Vector_impl_data._M_finish + 4) - 2U >> 1) + 7;
    }
    else {
      if (cVar1 != -0x80) {
        uVar2 = BufferStorage::frameSizeFromFmt(this);
        AVar6 = 0;
        uVar3 = (uint)(((long)Offset & 0xffffffffU) / (ulong)uVar2);
        goto LAB_00125365;
      }
      iVar5 = (*(int *)((long)&this[1].mData.
                               super__Vector_base<al::byte,_al::allocator<al::byte,_16UL>_>._M_impl.
                               super__Vector_impl_data._M_finish + 4) - 1U >> 1) + 4;
    }
    uVar2 = BufferStorage::channelsFromFmt(this);
    AVar6 = 0;
    uVar3 = (int)(((long)Offset & 0xffffffffU) / (ulong)(uVar2 * iVar5)) *
            *(int *)((long)&this[1].mData.
                            super__Vector_base<al::byte,_al::allocator<al::byte,_16UL>_>._M_impl.
                            super__Vector_impl_data._M_finish + 4);
  }
  else {
    if (OffsetType != 0x1025) {
      AVar6 = 0;
      uVar3 = 0;
      if (OffsetType != 0x1024) goto LAB_00125365;
      Offset = (double)this->mSampleRate * Offset;
    }
    dVar7 = modf(Offset,&local_30);
    dVar8 = 4294967295.0;
    if (local_30 <= 4294967295.0) {
      dVar8 = local_30;
    }
    uVar3 = (uint)(long)dVar8;
    dVar8 = 4095.0;
    if (dVar7 * 4096.0 <= 4095.0) {
      dVar8 = dVar7 * 4096.0;
    }
    AVar6 = (ALuint)(long)dVar8;
  }
LAB_00125365:
  uVar4 = 0;
  while( true ) {
    if (BufferList == (BufferlistItem *)0x0) {
      return __return_storage_ptr__;
    }
    if (uVar3 < uVar4) break;
    if (uVar3 - uVar4 < BufferList->mSampleLen) {
      (__return_storage_ptr__->field_1).mValue.pos = uVar3 - uVar4;
      (__return_storage_ptr__->field_1).mValue.frac = AVar6;
      (__return_storage_ptr__->field_1).mValue.bufferitem = BufferList;
      __return_storage_ptr__->mHasValue = true;
      return __return_storage_ptr__;
    }
    uVar4 = uVar4 + BufferList->mSampleLen;
    BufferList = (BufferList->mNext)._M_b._M_p;
  }
  return __return_storage_ptr__;
}

Assistant:

al::optional<VoicePos> GetSampleOffset(BufferlistItem *BufferList, ALenum OffsetType,
    double Offset)
{
    al::optional<VoicePos> ret;

    /* Find the first valid Buffer in the Queue */
    const BufferStorage *BufferFmt{nullptr};
    while(BufferList)
    {
        if((BufferFmt=BufferList->mBuffer) != nullptr) break;
        BufferList = BufferList->mNext.load(std::memory_order_relaxed);
    }
    if(!BufferList)
        return ret;

    /* Get sample frame offset */
    ALuint offset{0u}, frac{0u};
    double dbloff, dblfrac;
    switch(OffsetType)
    {
    case AL_SEC_OFFSET:
        dblfrac = std::modf(Offset*BufferFmt->mSampleRate, &dbloff);
        offset = static_cast<ALuint>(mind(dbloff, std::numeric_limits<ALuint>::max()));
        frac = static_cast<ALuint>(mind(dblfrac*MixerFracOne, MixerFracOne-1.0));
        break;

    case AL_SAMPLE_OFFSET:
        dblfrac = std::modf(Offset, &dbloff);
        offset = static_cast<ALuint>(mind(dbloff, std::numeric_limits<ALuint>::max()));
        frac = static_cast<ALuint>(mind(dblfrac*MixerFracOne, MixerFracOne-1.0));
        break;

    case AL_BYTE_OFFSET:
        /* Determine the ByteOffset (and ensure it is block aligned) */
        const ALbuffer *origbuf{BufferFromStorage(BufferFmt)};
        offset = static_cast<ALuint>(Offset);
        if(origbuf->OriginalType == UserFmtIMA4)
        {
            const ALuint align{(origbuf->OriginalAlign-1)/2 + 4};
            offset /= align * origbuf->channelsFromFmt();
            offset *= origbuf->OriginalAlign;
        }
        else if(origbuf->OriginalType == UserFmtMSADPCM)
        {
            const ALuint align{(origbuf->OriginalAlign-2)/2 + 7};
            offset /= align * origbuf->channelsFromFmt();
            offset *= origbuf->OriginalAlign;
        }
        else
            offset /= BufferFmt->frameSizeFromFmt();
        frac = 0;
        break;
    }

    /* Find the bufferlist item this offset belongs to. */
    ALuint totalBufferLen{0u};
    while(BufferList && totalBufferLen <= offset)
    {
        if(BufferList->mSampleLen > offset-totalBufferLen)
        {
            /* Offset is in this buffer */
            ret = {offset-totalBufferLen, frac, BufferList};
            return ret;
        }
        totalBufferLen += BufferList->mSampleLen;

        BufferList = BufferList->mNext.load(std::memory_order_relaxed);
    }

    /* Offset is out of range of the queue */
    return ret;
}